

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.h
# Opt level: O2

void __thiscall FIX::SessionSettings::SessionSettings(SessionSettings *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->m_settings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_settings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_settings)._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_settings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_settings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Dictionary::Dictionary(&this->m_defaults);
  this->m_resolveEnvVars = false;
  return;
}

Assistant:

SessionSettings() { m_resolveEnvVars = false; }